

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcShapeModel::IfcShapeModel(IfcShapeModel *this,void **vtt)

{
  void **vtt_local;
  IfcShapeModel *this_local;
  
  IfcRepresentation::IfcRepresentation(&this->super_IfcRepresentation,vtt + 1);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcShapeModel,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcShapeModel,_0UL> *)
             &(this->super_IfcRepresentation).field_0x80,vtt + 5);
  (this->super_IfcRepresentation).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>._vptr_ObjectHelper =
       (_func_int **)*vtt;
  *(void **)((long)&(this->super_IfcRepresentation).
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>.
                    _vptr_ObjectHelper +
            (long)(this->super_IfcRepresentation).
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>.
                  _vptr_ObjectHelper[-3]) = vtt[7];
  *(void **)&(this->super_IfcRepresentation).field_0x80 = vtt[8];
  return;
}

Assistant:

IfcShapeModel() : Object("IfcShapeModel") {}